

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O2

Entry * __thiscall
wasm::TypeBuilder::Entry::copy<TypeTest_CanonicalizeExactRefs_Test::TestBody()::__0>
          (Entry *this,HeapType type,anon_class_8_1_911e227b map)

{
  anon_class_16_2_633b9489 *paVar1;
  Type TVar2;
  uintptr_t *puVar3;
  undefined4 uVar4;
  HeapType HVar5;
  Type TVar6;
  long *plVar7;
  uintptr_t *puVar8;
  undefined1 auVar9 [16];
  Signature SVar10;
  Array AVar11;
  undefined1 local_b0 [8];
  anon_class_16_2_633b9489 copySingleType;
  undefined1 auStack_88 [8];
  vector<wasm::Field,_std::allocator<wasm::Field>_> fields;
  undefined1 auStack_68 [8];
  Field field;
  undefined1 local_50 [8];
  anon_class_16_2_ecc023e0 copyType;
  
  paVar1 = (anon_class_16_2_633b9489 *)this->builder;
  TVar2.id = this->index;
  copyType.this = map.builder;
  if (type.id < 0x7d) {
    __assert_fail("!type.isBasic()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0x2df,
                  "void wasm::TypeBuilder::copyHeapType(size_t, HeapType, F) [F = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp:445:20)]"
                 );
  }
  auVar9 = ::wasm::HeapType::getDeclaredSuperType();
  if ((auVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    HVar5 = TypeTest_CanonicalizeExactRefs_Test::TestBody::anon_class_8_1_911e227b::operator()
                      ((anon_class_8_1_911e227b *)&copyType.this,auVar9._0_8_);
    ::wasm::TypeBuilder::setSubType(paVar1,TVar2.id,HVar5.id,1);
  }
  auVar9 = ::wasm::HeapType::getDescriptorType();
  if ((auVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    HVar5 = TypeTest_CanonicalizeExactRefs_Test::TestBody::anon_class_8_1_911e227b::operator()
                      ((anon_class_8_1_911e227b *)&copyType.this,auVar9._0_8_);
    ::wasm::TypeBuilder::setDescriptor(paVar1,TVar2.id,HVar5.id,1);
  }
  auVar9 = ::wasm::HeapType::getDescribedType();
  if ((auVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    HVar5 = TypeTest_CanonicalizeExactRefs_Test::TestBody::anon_class_8_1_911e227b::operator()
                      ((anon_class_8_1_911e227b *)&copyType.this,auVar9._0_8_);
    ::wasm::TypeBuilder::setDescribed(paVar1,TVar2.id,HVar5.id,1);
  }
  ::wasm::HeapType::isOpen();
  ::wasm::TypeBuilder::setOpen((ulong)paVar1,SUB81(TVar2.id,0));
  ::wasm::HeapType::getShared();
  ::wasm::TypeBuilder::setShared((ulong)paVar1,(Shareability)TVar2.id);
  local_50 = (undefined1  [8])local_b0;
  copySingleType.this = (TypeBuilder *)&copyType.this;
  local_b0 = (undefined1  [8])paVar1;
  copyType.copySingleType = paVar1;
  uVar4 = ::wasm::HeapType::getKind();
  switch(uVar4) {
  case 0:
    ::wasm::handle_unreachable
              ("unexpected kind",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
               ,0x31b);
  case 1:
    auVar9 = ::wasm::HeapType::getSignature();
    TVar6 = copyHeapType<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp:445:20)>
            ::anon_class_16_2_ecc023e0::operator()
                      ((anon_class_16_2_ecc023e0 *)local_50,auVar9._0_8_);
    copyHeapType<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp:445:20)>
    ::anon_class_16_2_ecc023e0::operator()((anon_class_16_2_ecc023e0 *)local_50,(Type)auVar9._8_8_);
    SVar10.results.id = TVar6.id;
    SVar10.params.id = TVar2.id;
    ::wasm::TypeBuilder::setHeapType((ulong)paVar1,SVar10);
    break;
  case 2:
    copySingleType.map = (anon_class_8_1_911e227b *)this;
    plVar7 = (long *)::wasm::HeapType::getStruct();
    auStack_88 = (undefined1  [8])0x0;
    fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<wasm::Field,_std::allocator<wasm::Field>_>::reserve
              ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_88,
               plVar7[1] - *plVar7 >> 4);
    puVar3 = (uintptr_t *)plVar7[1];
    for (puVar8 = (uintptr_t *)*plVar7; puVar8 != puVar3; puVar8 = puVar8 + 2) {
      auStack_68 = (undefined1  [8])*puVar8;
      field.type.id = puVar8[1];
      auStack_68 = (undefined1  [8])
                   copyHeapType<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp:445:20)>
                   ::anon_class_16_2_ecc023e0::operator()
                             ((anon_class_16_2_ecc023e0 *)local_50,(Type)auStack_68);
      std::vector<wasm::Field,_std::allocator<wasm::Field>_>::push_back
                ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_88,
                 (value_type *)auStack_68);
    }
    std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
              ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_68,
               (vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_88);
    ::wasm::TypeBuilder::setHeapType((ulong)paVar1,(Struct *)TVar2.id);
    this = (Entry *)copySingleType.map;
    std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
              ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_68);
    std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
              ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_88);
    break;
  case 3:
    ::wasm::HeapType::getArray();
    auStack_88 = (undefined1  [8])
                 copyHeapType<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp:445:20)>
                 ::anon_class_16_2_ecc023e0::operator()
                           ((anon_class_16_2_ecc023e0 *)local_50,(Type)auStack_88);
    AVar11.element._8_8_ = auStack_88;
    AVar11.element.type.id = TVar2.id;
    ::wasm::TypeBuilder::setHeapType((ulong)paVar1,AVar11);
    break;
  case 4:
    HVar5.id = ::wasm::HeapType::getContinuation();
    TypeTest_CanonicalizeExactRefs_Test::TestBody::anon_class_8_1_911e227b::operator()
              ((anon_class_8_1_911e227b *)&copyType.this,HVar5);
    ::wasm::TypeBuilder::setHeapType((ulong)paVar1,(Continuation)TVar2.id);
  }
  return this;
}

Assistant:

Entry& copy(HeapType type, F map) {
      builder.copyHeapType(index, type, map);
      return *this;
    }